

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gal2obs.cpp
# Opt level: O0

CEExecOptions * DefineOpts(void)

{
  CEExecOptions *in_RDI;
  CEExecOptions *opts;
  CEExecOptions *in_stack_000002a0;
  string *desc;
  CEExecOptions *__lhs;
  string *in_stack_ffffffffffffff38;
  CEExecOptions *in_stack_ffffffffffffff40;
  string local_a8 [32];
  string local_88 [24];
  CEExecOptions *in_stack_ffffffffffffff90;
  string local_68 [55];
  allocator local_31;
  string local_30 [32];
  undefined7 in_stack_fffffffffffffff0;
  undefined1 uVar1;
  
  uVar1 = 0;
  __lhs = in_RDI;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_30,"gal2obs",&local_31);
  CEExecOptions::CEExecOptions(in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
  std::__cxx11::string::~string(local_30);
  std::allocator<char>::~allocator((allocator<char> *)&local_31);
  desc = (string *)&stack0xffffffffffffff38;
  std::__cxx11::string::string((string *)desc);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__lhs,
                 (char *)in_RDI);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__lhs,
                 (char *)in_RDI);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__lhs,
                 (char *)in_RDI);
  CLOptions::AddProgramDescription(&in_RDI->super_CLOptions,desc);
  std::__cxx11::string::~string(local_68);
  std::__cxx11::string::~string(local_88);
  std::__cxx11::string::~string(local_a8);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffff38);
  CEExecOptions::AddGalacticPars((CEExecOptions *)CONCAT17(uVar1,in_stack_fffffffffffffff0));
  CEExecOptions::AddObserverPars(in_stack_000002a0);
  CEExecOptions::AddJDPar(in_stack_ffffffffffffff90);
  return __lhs;
}

Assistant:

CEExecOptions DefineOpts()
{
    CEExecOptions opts("gal2obs");

    // Add a program version and description
    opts.AddProgramDescription(std::string() +
        "Converts from Galactic coordinates to observed altitude and zenith " +
        "coordinates for a given Julian date. Additional observing conditions " +
        "an also be specified to allow more accurate coordinate values.");

    // Set the options
    opts.AddGalacticPars();
    opts.AddObserverPars();
    opts.AddJDPar();

    return opts;
}